

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_1::drawRandomPrimitives
               (RenderContext *renderCtx,deUint32 program,PrimitiveType primType,int numPrimitives,
               Random *rnd)

{
  bool bVar1;
  pointer pVVar2;
  pointer pVVar3;
  deRandom *pdVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 uVar8;
  undefined4 extraout_var;
  int iVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  int iVar13;
  bool bVar14;
  byte bVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> vertices;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  Vec2 v;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_148;
  long local_128;
  deRandom *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> local_108;
  ulong local_e8;
  ulong local_e0;
  RenderContext *local_d8;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  Type local_b0;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  int local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  void *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int local_58;
  VertexArrayPointer local_50;
  
  uVar17 = (ulong)primType;
  local_120 = &rnd->m_rnd;
  local_d8 = renderCtx;
  iVar6 = (*renderCtx->_vptr_RenderContext[3])();
  local_128 = CONCAT44(extraout_var,iVar6);
  iVar6 = 0;
  local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_start = (VertexArrayBinding *)0x0;
  local_108.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = true;
  switch(uVar17) {
  case 0:
    iVar6 = 3;
    break;
  case 1:
  case 2:
    iVar6 = 2;
    break;
  case 3:
  case 4:
    iVar6 = 1;
    break;
  default:
    bVar1 = false;
  }
  local_e8 = uVar17;
  local_e0 = uVar17;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&local_148,(long)(iVar6 * numPrimitives));
  pdVar4 = local_120;
  if (local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    fVar21 = *(float *)(&DAT_01c80ec0 + (ulong)(primType == PRIMITIVETYPE_TRIANGLE) * 4);
    local_118 = CONCAT44(local_118._4_4_,
                         *(undefined4 *)(&DAT_01c80ec8 + (ulong)((int)local_e8 == 0) * 4));
    uVar17 = 0;
    do {
      fVar20 = deRandom_getFloat(pdVar4);
      local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[0] =
           fVar20 * (float)local_118 + fVar21;
      fVar20 = deRandom_getFloat(pdVar4);
      local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[1] =
           fVar20 * (float)local_118 + fVar21;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)((long)local_148.
                                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_148.
                                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (0 < numPrimitives) {
    iVar13 = 0;
    uVar17 = 0;
    do {
      iVar9 = iVar6 * (int)uVar17;
      lVar11 = 0;
      bVar5 = true;
      do {
        bVar14 = bVar5;
        if (bVar1) {
          bVar15 = 1;
          bVar12 = 1;
          uVar10 = (ulong)(iVar6 + (uint)(iVar6 == 0));
          iVar16 = iVar13;
          do {
            bVar12 = bVar12 & local_148.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar16].m_data[lVar11] <=
                              -0.9;
            bVar15 = bVar15 & 0.9 <= local_148.
                                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[iVar16].m_data
                                     [lVar11];
            iVar16 = iVar16 + 1;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
          if ((bool)(bVar12 | bVar15)) goto LAB_016370a9;
        }
        else {
LAB_016370a9:
          *(ulong *)local_148.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data =
               *(ulong *)local_148.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar9].m_data ^
               0x8000000080000000;
        }
        lVar11 = 1;
        bVar5 = false;
      } while (bVar14);
      uVar17 = uVar17 + 1;
      iVar13 = iVar13 + iVar6;
    } while (uVar17 != (uint)numPrimitives);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"a_position","");
  pVVar3 = local_148.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar2 = local_148.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_b0 = TYPE_NAME;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_d0,local_c8 + (long)local_d0);
  local_88 = 0;
  local_80._0_4_ = local_b0;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_a8,local_a0 + (long)local_a8);
  local_58 = local_88;
  local_50.componentType = VTX_COMP_FLOAT;
  local_50.convert = VTX_COMP_CONVERT_NONE;
  local_50.numComponents = 2;
  local_50.numElements = (int)((ulong)((long)pVVar3 - (long)pVVar2) >> 3);
  local_50.stride = 0;
  local_50.data = pVVar2;
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_108,(VertexArrayBinding *)local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  lVar11 = local_128;
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  (**(code **)(lVar11 + 0x1680))(program);
  pdVar4 = local_120;
  lVar11 = local_128;
  uVar19 = (uint)local_e8;
  if (uVar19 - 3 < 2) {
    local_80 = (undefined1  [8])0x0;
    (**(code **)(local_128 + 0x818))(0x846d);
    pdVar4 = local_120;
    dVar7 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar7,"glGetFloatv()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                    ,0x9e);
    if (uVar19 == 4) {
      fVar21 = deRandom_getFloat(pdVar4);
      fVar21 = fVar21 * 16.0 + 16.0;
      uVar18 = -(uint)(fVar21 <= (float)local_80._4_4_);
      local_118 = CONCAT44(extraout_XMM0_Db,~uVar18 & local_80._4_4_ | (uint)fVar21 & uVar18);
      uStack_110 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
    }
    else {
      local_118 = 0x3f800000;
      uStack_110 = 0;
    }
    uVar8 = (**(code **)(lVar11 + 0xb48))(program,"u_pointSize");
    (**(code **)(lVar11 + 0x14e0))((float)local_118,uVar8);
  }
  else if (uVar19 == 2) {
    local_80 = (undefined1  [8])0x0;
    (**(code **)(local_128 + 0x818))(0x846e);
    dVar7 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar7,"glGetFloatv()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                    ,0x9e);
    fVar21 = deRandom_getFloat(pdVar4);
    fVar21 = fVar21 * 16.0 + 16.0;
    uVar19 = -(uint)(fVar21 <= (float)local_80._4_4_);
    (**(code **)(lVar11 + 0xce0))(~uVar19 & local_80._4_4_ | (uint)fVar21 & uVar19);
    uVar17 = (long)local_108.
                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_108.
                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    local_80._0_4_ = TYPE_LAST|TYPE_NAME;
    goto LAB_016373dd;
  }
  uVar17 = (long)local_108.
                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_108.
                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (uVar19 < 5) {
    (*(code *)(&DAT_01c80ee4 + *(int *)(&DAT_01c80ee4 + local_e0 * 4)))();
    return;
  }
  local_80._0_4_ = 8;
LAB_016373dd:
  local_80._4_4_ =
       (int)((ulong)((long)local_148.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_148.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_78._M_p._0_4_ = 3;
  local_70 = (void *)0x0;
  glu::draw(local_d8,program,(int)(uVar17 >> 4) * -0x33333333,
            local_108.
            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
            _M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)local_80,
            (DrawUtilCallback *)0x0);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            (&local_108);
  if (local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void drawRandomPrimitives (const glu::RenderContext& renderCtx, deUint32 program, PrimitiveType primType, int numPrimitives, de::Random* rnd)
{
	const glw::Functions&			gl				= renderCtx.getFunctions();
	const float						minPointSize	= 16.0f;
	const float						maxPointSize	= 32.0f;
	const float						minLineWidth	= 16.0f;
	const float						maxLineWidth	= 32.0f;
	vector<Vec2>					vertices;
	vector<glu::VertexArrayBinding>	vertexArrays;

	genVertices(primType, numPrimitives, rnd, &vertices);

	vertexArrays.push_back(glu::va::Float("a_position", 2, (int)vertices.size(), 0, (const float*)&vertices[0]));

	gl.useProgram(program);

	// Special state for certain primitives
	if (primType == PRIMITIVETYPE_POINT || primType == PRIMITIVETYPE_WIDE_POINT)
	{
		const Vec2		range			= getRange(gl, GL_ALIASED_POINT_SIZE_RANGE);
		const bool		isWidePoint		= primType == PRIMITIVETYPE_WIDE_POINT;
		const float		pointSize		= isWidePoint ? de::min(rnd->getFloat(minPointSize, maxPointSize), range.y()) : 1.0f;
		const int		pointSizeLoc	= gl.getUniformLocation(program, "u_pointSize");

		gl.uniform1f(pointSizeLoc, pointSize);
	}
	else if (primType == PRIMITIVETYPE_WIDE_LINE)
	{
		const Vec2		range			= getRange(gl, GL_ALIASED_LINE_WIDTH_RANGE);
		const float		lineWidth		= de::min(rnd->getFloat(minLineWidth, maxLineWidth), range.y());

		gl.lineWidth(lineWidth);
	}

	glu::draw(renderCtx, program, (int)vertexArrays.size(), &vertexArrays[0],
			  glu::PrimitiveList(getGluPrimitiveType(primType), (int)vertices.size()));
}